

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tent_dist.hpp
# Opt level: O2

result_type_conflict3 * __thiscall
trng::tent_dist<long_double>::pdf
          (result_type_conflict3 *__return_storage_ptr__,tent_dist<long_double> *this,
          result_type_conflict3 x)

{
  undefined7 in_register_00000001;
  
  return (result_type_conflict3 *)
         CONCAT71(in_register_00000001,
                  x._0_10_ - *(longdouble *)__return_storage_ptr__ <=
                  -*(longdouble *)(__return_storage_ptr__ + 1));
}

Assistant:

pdf(result_type x) const {
      x -= P.m();
      if (x <= -P.d() or x >= P.d())
        return 0;
      return x < 0 ? (1 + x / P.d()) / P.d() : (1 - x / P.d()) / P.d();
    }